

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool __thiscall PartiallySignedTransaction::IsNull(PartiallySignedTransaction *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  
  if ((((this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_engaged == false) &&
      ((this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar1 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::IsNull() const
{
    return !tx && inputs.empty() && outputs.empty() && unknown.empty();
}